

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sswInt.h
# Opt level: O3

Aig_Obj_t * Ssw_ObjFrame_(Ssw_Frm_t *p,Aig_Obj_t *pObj,int i)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  long lVar4;
  int in_ECX;
  int iVar5;
  int iVar6;
  
  iVar5 = (int)p * in_ECX;
  uVar1 = iVar5 + i;
  iVar2 = *(int *)((long)&pObj->field_0 + 4);
  if ((int)uVar1 < iVar2) goto LAB_005e0e34;
  iVar6 = iVar5 + i + 1;
  iVar5 = (pObj->field_0).CioId;
  if ((int)uVar1 < iVar5 * 2) {
    if (iVar5 <= (int)uVar1) {
      if (pObj->pFanin0 == (Aig_Obj_t *)0x0) {
        pAVar3 = (Aig_Obj_t *)malloc((long)iVar5 << 4);
      }
      else {
        pAVar3 = (Aig_Obj_t *)realloc(pObj->pFanin0,(long)iVar5 << 4);
      }
      pObj->pFanin0 = pAVar3;
      iVar2 = iVar5 * 2;
LAB_005e0e0d:
      (pObj->field_0).CioId = iVar2;
      iVar2 = *(int *)((long)&pObj->field_0 + 4);
    }
  }
  else if (iVar5 <= (int)uVar1) {
    if (pObj->pFanin0 == (Aig_Obj_t *)0x0) {
      pAVar3 = (Aig_Obj_t *)malloc((long)iVar6 << 3);
    }
    else {
      pAVar3 = (Aig_Obj_t *)realloc(pObj->pFanin0,(long)iVar6 << 3);
    }
    pObj->pFanin0 = pAVar3;
    iVar2 = iVar6;
    goto LAB_005e0e0d;
  }
  if (iVar2 <= (int)uVar1) {
    lVar4 = (long)iVar2;
    do {
      (&pObj->pFanin0->field_0)[lVar4].pNext = (Aig_Obj_t *)0x0;
      lVar4 = lVar4 + 1;
    } while (iVar6 != lVar4);
  }
  *(int *)((long)&pObj->field_0 + 4) = iVar6;
  iVar2 = iVar6;
LAB_005e0e34:
  if ((-1 < (int)uVar1) && ((int)uVar1 < iVar2)) {
    return (&pObj->pFanin0->field_0)[uVar1].pNext;
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

static inline Aig_Obj_t * Ssw_ObjFrame_( Ssw_Frm_t * p, Aig_Obj_t * pObj, int i )                       { return (Aig_Obj_t *)Vec_PtrGetEntry( p->vAig2Frm, p->nObjs*i+pObj->Id );     }